

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int compare_multisig_node(void *source,void *destination)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = *(uint *)((long)source + 0x4c);
  if (uVar3 != *(uint *)((long)destination + 0x4c)) {
    return (uint)*(byte *)((long)source + 8) - (uint)*(byte *)((long)destination + 8);
  }
  if ((ulong)uVar3 != 0) {
    uVar4 = 0;
    do {
      bVar1 = *(byte *)((long)source + uVar4 + 8);
      bVar2 = *(byte *)((long)destination + uVar4 + 8);
      if (bVar1 != bVar2) {
        return (uint)bVar1 - (uint)bVar2;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return 0;
}

Assistant:

static int compare_multisig_node(const void *source, const void *destination)
{
    const struct multisig_sort_data_t *src = (const struct multisig_sort_data_t *)source;
    const struct multisig_sort_data_t *dest = (const struct multisig_sort_data_t *)destination;
    uint32_t index = 0;
    if (src->script_size != dest->script_size) {
        /* Head byte of compressed pubkey and uncompressed pubkey are different. */
        return (int)src->script[0] - (int)dest->script[0];
    }

    for (; index < src->script_size; ++index) {
        if (src->script[index] != dest->script[index]) {
            return (int)src->script[index] - (int)dest->script[index];
        }
    }
    return 0;
}